

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

void test_regular_announcement(rtr_socket *socket)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  rtr_socket *socket_local;
  undefined4 local_80;
  undefined4 local_7c;
  undefined1 local_78 [8];
  aspa_record _records345 [1];
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined1 local_48 [8];
  update_callback _callbacks340 [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  begin_cache_response('\x02',0);
  _callbacks340[0].type = 0x4d;
  _callbacks340[0]._33_3_ = 4;
  _callbacks340[0]._36_4_ = 0x44e;
  append_aspa('\x02','\x01',0x44c,(uint32_t *)&_callbacks340[0].type,4);
  end_cache_response('\x02',0,0x1b5);
  local_48 = (undefined1  [8])0x0;
  _callbacks340[0].source._0_4_ = 0x44c;
  _callbacks340[0].record.customer_asn = 4;
  _callbacks340[0].record._4_4_ = 0;
  local_58 = 0x44d;
  local_54 = 0x44e;
  local_50 = 0x44f;
  local_4c = 0x450;
  _callbacks340[0].record.provider_count = (size_t)&local_58;
  _callbacks340[0].record.provider_asns._0_1_ = 1;
  expect_update_callbacks((update_callback *)local_48,1);
  iVar2 = rtr_sync(socket);
  if (iVar2 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x156,"void test_regular_announcement(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    local_78._0_4_ = 0x44c;
    _records345[0].customer_asn = 4;
    _records345[0]._4_4_ = 0;
    socket_local._0_4_ = 0x44d;
    socket_local._4_4_ = 0x44e;
    local_80 = 0x44f;
    local_7c = 0x450;
    _records345[0].provider_count = (size_t)&socket_local;
    assert_table(socket,(aspa_record *)local_78,1);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x157,"void test_regular_announcement(struct rtr_socket *)");
}

Assistant:

static void test_regular_announcement(struct rtr_socket *socket)
{
	// Test: regular announcement
	// Expect: OK
	// DB: inserted
	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1100, ASNS(1101, 1102, 1103, 1104));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1100, ASNS(1101, 1102, 1103, 1104))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket, RECORD(1100, ASNS(1101, 1102, 1103, 1104)));
}